

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

void __thiscall
HighsDomain::CutpoolPropagation::markPropagateCut(CutpoolPropagation *this,HighsInt cut)

{
  byte *pbVar1;
  pointer pHVar2;
  iterator __position;
  HighsInt local_c;
  
  if (((this->propagatecutflags_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start[cut] == '\0') &&
     (((this->activitycutsinf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[cut] == 1 ||
      (pHVar2 = (this->activitycuts_).
                super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_start,
      (this->cutpool->rhs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[cut] - (pHVar2[cut].hi + pHVar2[cut].lo) <=
      (this->capacityThreshold_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[cut])))) {
    __position._M_current =
         (this->propagatecutinds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_c = cut;
    if (__position._M_current ==
        (this->propagatecutinds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->propagatecutinds_,__position,&local_c);
    }
    else {
      *__position._M_current = cut;
      (this->propagatecutinds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    pbVar1 = (this->propagatecutflags_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + local_c;
    *pbVar1 = *pbVar1 | 1;
  }
  return;
}

Assistant:

void HighsDomain::CutpoolPropagation::markPropagateCut(HighsInt cut) {
  if (!propagatecutflags_[cut] &&
      (activitycutsinf_[cut] == 1 ||
       (cutpool->getRhs()[cut] - double(activitycuts_[cut]) <=
        capacityThreshold_[cut]))) {
    propagatecutinds_.push_back(cut);
    propagatecutflags_[cut] |= 1;
  }
}